

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

bool leveldb::GetLevel(Slice *input,int *level)

{
  bool bVar1;
  uint in_register_00000004;
  uint32_t v;
  uint local_14;
  
  local_14 = in_register_00000004;
  bVar1 = GetVarint32(input,&local_14);
  if (local_14 < 7 && bVar1) {
    *level = local_14;
  }
  return local_14 < 7 && bVar1;
}

Assistant:

static bool GetLevel(Slice* input, int* level) {
  uint32_t v;
  if (GetVarint32(input, &v) && v < config::kNumLevels) {
    *level = v;
    return true;
  } else {
    return false;
  }
}